

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

void __thiscall
QItemDelegate::paint
          (QItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,QModelIndex *index)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  CheckState CVar4;
  undefined8 uVar5;
  State SVar6;
  QItemDelegate *this_00;
  anon_union_24_3_e3d07ef4_for_data *paVar7;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  long in_FS_OFFSET;
  QRect local_1b8;
  QArrayDataPointer<char16_t> local_1a8;
  QRect local_188;
  undefined1 *local_178;
  undefined8 uStack_170;
  undefined1 *local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  QStyleOptionViewItem opt;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(anon_union_24_3_e3d07ef4_for_data **)&(this->super_QAbstractItemDelegate).field_0x8;
  this_00 = (QItemDelegate *)0xaa;
  memset(&opt,0xaa,0xd0);
  setOptions(&opt,this_00,index,option);
  QPainter::save();
  if ((bool)this_01->data[0x80] == true) {
    QPainter::setClipRect((QRect *)painter,(int)&opt + 0x10);
  }
  local_58._16_8_ = 0;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_40 = 2;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_168);
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_170 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QVariant *)&local_78,index,1);
  paVar7 = &local_78;
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  if (local_40 < 4) {
    QIcon::QIcon((QIcon *)&local_78.shared);
    QIcon::operator=((QIcon *)(this_01->data + 0xa8),(QIcon *)&local_78.shared);
    QIcon::~QIcon((QIcon *)&local_78.shared);
    uStack_170._0_4_ = -1;
    uStack_170._4_4_ = uStack_170._0_4_;
  }
  else {
    decoration((QItemDelegate *)&local_78,(QStyleOptionViewItem *)paVar7,(QVariant *)&opt);
    QPixmap::operator=((QPixmap *)&local_168,(QPixmap *)local_78.data);
    QPixmap::~QPixmap((QPixmap *)local_78.data);
    iVar3 = ::QVariant::typeId((QVariant *)&local_58);
    paVar7 = this_01 + 7;
    if (iVar3 == 0x1005) {
      qvariant_cast<QIcon>((QVariant *)&local_78);
      QIcon::operator=((QIcon *)&paVar7->shared,(QIcon *)&local_78.shared);
      QIcon::~QIcon((QIcon *)&local_78.shared);
      uVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
              super_QFlagsStorage<QStyle::StateFlag>.i;
      SVar6 = (uint)(int)(short)uVar1 >> 0xf & 3;
      if ((uVar1 & 1) == 0) {
        SVar6 = Off;
      }
      *(State *)(this_01->data + 0xb0) = SVar6;
      *(uint *)(this_01->data + 0xb4) =
           (uint)(((option->super_QStyleOption).state.
                   super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                   super_QFlagsStorage<QStyle::StateFlag>.i >> 0x12 & 1) == 0);
      uVar5 = QIcon::actualSize((QSize *)&paVar7->shared,(int)option + 0x50,SVar6);
    }
    else {
      QIcon::QIcon((QIcon *)&local_78.shared);
      QIcon::operator=((QIcon *)&paVar7->shared,(QIcon *)&local_78.shared);
      QIcon::~QIcon((QIcon *)&local_78.shared);
      uVar5 = QPixmap::size();
    }
    uStack_170._0_4_ = (int)uVar5 + -1;
    uStack_170._4_4_ = (int)((ulong)uVar5 >> 0x20) + -1;
  }
  local_178 = (undefined1 *)0x0;
  local_188 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  QModelIndex::data((QVariant *)&local_78,index,10);
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  CVar4 = Unchecked;
  if (3 < local_40) {
    paVar7 = &local_58;
    CVar4 = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>((QVariant *)&local_58);
    local_188 = doCheck((QItemDelegate *)paVar7,&opt,&opt.super_QStyleOption.rect,
                        (QVariant *)&local_58);
  }
  local_1a8.d = (Data *)0x0;
  local_1a8.ptr = (char16_t *)0x0;
  local_1a8.size = 0;
  local_1b8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  paVar7 = &local_78;
  QModelIndex::data((QVariant *)paVar7,index,0);
  ::QVariant::operator=((QVariant *)&local_58,(QVariant *)paVar7);
  ::QVariant::~QVariant((QVariant *)paVar7);
  if (3 < local_40) {
    paVar7 = &local_58;
    cVar2 = ::QVariant::isNull();
    if (cVar2 == '\0') {
      QItemDelegatePrivate::valueToText
                ((QString *)&local_78,(QItemDelegatePrivate *)this_01,(QVariant *)&local_58,&opt);
      local_1a8.ptr = (char16_t *)local_78._8_8_;
      local_1a8.d = (Data *)local_78.shared;
      local_78.shared = (PrivateShared *)0x0;
      local_78._8_8_ = 0;
      local_1a8.size = local_78._16_8_;
      local_78._16_8_ = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      local_1b8 = QItemDelegatePrivate::displayRect
                            ((QItemDelegatePrivate *)this_01,index,&opt,(QRect *)&local_178,
                             &local_188);
      paVar7 = this_01;
    }
  }
  doLayout((QItemDelegate *)paVar7,&opt,&local_188,(QRect *)&local_178,&local_1b8,false);
  drawBackground((QItemDelegate *)paVar7,painter,&opt,index);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 200))
            (this,painter,&opt,&local_188,CVar4);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xb8))
            (this,painter,&opt,(QRect *)&local_178,(QPixmap *)&local_168);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xb0))
            (this,painter,&opt,&local_1b8,&local_1a8);
  (**(code **)(*(long *)&this->super_QAbstractItemDelegate + 0xc0))(this,painter,&opt,&local_1b8);
  QPainter::restore();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
  QPixmap::~QPixmap((QPixmap *)&local_168);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QStyleOptionViewItem::~QStyleOptionViewItem(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::paint(QPainter *painter,
                          const QStyleOptionViewItem &option,
                          const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = setOptions(index, option);

    // prepare
    painter->save();
    if (d->clipPainting)
        painter->setClipRect(opt.rect);

    // get the data and the rectangles

    QVariant value;

    QPixmap pixmap;
    QRect decorationRect;
    value = index.data(Qt::DecorationRole);
    if (value.isValid()) {
        // ### we need the pixmap to call the virtual function
        pixmap = decoration(opt, value);
        if (value.userType() == QMetaType::QIcon) {
            d->tmp.icon = qvariant_cast<QIcon>(value);
            d->tmp.mode = d->iconMode(option.state);
            d->tmp.state = d->iconState(option.state);
            const QSize size = d->tmp.icon.actualSize(option.decorationSize,
                                                      d->tmp.mode, d->tmp.state);
            decorationRect = QRect(QPoint(0, 0), size);
        } else {
            d->tmp.icon = QIcon();
            decorationRect = QRect(QPoint(0, 0), pixmap.size());
        }
    } else {
        d->tmp.icon = QIcon();
        decorationRect = QRect();
    }

    QRect checkRect;
    Qt::CheckState checkState = Qt::Unchecked;
    value = index.data(Qt::CheckStateRole);
    if (value.isValid()) {
        checkState = QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(value);
        checkRect = doCheck(opt, opt.rect, value);
    }

    QString text;
    QRect displayRect;
    value = index.data(Qt::DisplayRole);
    if (value.isValid() && !value.isNull()) {
        text = d->valueToText(value, opt);
        displayRect = d->displayRect(index, opt, decorationRect, checkRect);
    }

    // do the layout

    doLayout(opt, &checkRect, &decorationRect, &displayRect, false);

    // draw the item

    drawBackground(painter, opt, index);
    drawCheck(painter, opt, checkRect, checkState);
    drawDecoration(painter, opt, decorationRect, pixmap);
    drawDisplay(painter, opt, displayRect, text);
    drawFocus(painter, opt, displayRect);

    // done
    painter->restore();
}